

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  ExecutionModel EVar6;
  int iVar7;
  SPIRVariable *var;
  Bitset *pBVar8;
  char *pcVar9;
  char *local_c8;
  char *addr_space;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b0;
  Bitset flags;
  char **local_38;
  
  flags.lower = 0;
  flags.higher._M_h._M_buckets = &flags.higher._M_h._M_single_bucket;
  flags.higher._M_h._M_bucket_count = 1;
  flags.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flags.higher._M_h._M_element_count = 0;
  flags.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  flags.higher._M_h._M_rehash_policy._M_next_resize = 0;
  flags.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  var = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id);
  if (((var == (SPIRVariable *)0x0) || (*(int *)&(type->super_IVariant).field_0xc != 0xf)) ||
     ((bVar3 = Compiler::has_decoration
                         ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
      !bVar3 && (bVar3 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)(type->super_IVariant).self.id,
                                    DecorationBufferBlock), !bVar3)))) {
    pBVar8 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    Bitset::operator=(&flags,pBVar8);
  }
  else {
    Compiler::get_buffer_block_flags((Bitset *)&addr_space,(Compiler *)this,(VariableID)id);
    Bitset::operator=(&flags,(Bitset *)&addr_space);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b0);
  }
  addr_space = (char *)0x0;
  switch(type->storage) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case StorageClassPushConstant:
    iVar7 = *(int *)&(type->super_IVariant).field_0xc;
    if (iVar7 == 0xf) {
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
      pcVar9 = "const device";
      if (((uint)flags.lower >> 0x18 & 1) == 0) {
        pcVar9 = "device";
      }
      addr_space = "constant";
      if (bVar3) {
        addr_space = pcVar9;
      }
      goto LAB_00309a93;
    }
    if (!argument) {
      addr_space = "constant";
      goto LAB_00309a93;
    }
    if (((iVar7 == 0x10) && ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      addr_space = "";
      goto LAB_00309a93;
    }
    break;
  case StorageClassInput:
    bVar3 = is_tesc_shader(this);
    if ((bVar3 && var != (SPIRVariable *)0x0) &&
       ((var->basevariable).id == (this->stage_in_ptr_var_id).id)) {
      local_c8 = "threadgroup";
      addr_space = local_c8;
      if ((this->msl_options).multi_patch_workgroup != false) {
        local_c8 = "const device";
        addr_space = local_c8;
      }
    }
    else {
      local_c8 = (char *)0x0;
    }
    bVar3 = is_tese_shader(this);
    if (((bVar3 && var != (SPIRVariable *)0x0) & (this->msl_options).raw_buffer_tese_input) == 1) {
      uVar1 = (var->basevariable).id;
      uVar2 = (this->stage_in_ptr_var_id).id;
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPatch);
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
      uVar5 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
      if ((uVar1 == uVar2) || (bVar3 && (!bVar4 || 1 < uVar5 - 0xb))) {
        local_c8 = "const device";
        addr_space = "const device";
      }
    }
    EVar6 = Compiler::get_execution_model((Compiler *)this);
    if (((var != (SPIRVariable *)0x0) && (EVar6 == ExecutionModelFragment)) &&
       ((var->basevariable).id == (this->stage_in_var_id).id)) {
LAB_00309a23:
      addr_space = "thread";
      goto LAB_00309a93;
    }
    if (local_c8 != (char *)0x0) goto LAB_00309a93;
    break;
  case StorageClassOutput:
    if (this->capture_output_to_buffer == true) {
      if (var != (SPIRVariable *)0x0) {
        bVar3 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
        if (bVar3) {
          bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
          if (!bVar3) goto LAB_00309a23;
        }
        else {
          iVar7 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,var,4);
          if ((char)iVar7 == '\0') goto LAB_00309a87;
        }
switchD_0030980e_caseD_4:
        addr_space = "threadgroup";
        goto LAB_00309a93;
      }
      goto LAB_00309a87;
    }
    break;
  case StorageClassWorkgroup:
    goto switchD_0030980e_caseD_4;
  case StorageClassCrossWorkgroup:
  case StorageClassPrivate:
  case StorageClassFunction:
  case StorageClassGeneric:
  case StorageClassAtomicCounter:
  case StorageClassImage:
    break;
  case StorageClassStorageBuffer:
switchD_0030980e_caseD_c:
    if ((var == (SPIRVariable *)0x0) ||
       (bVar3 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
       bVar3)) {
      addr_space = "const device";
      if ((flags.lower & 0x1000000) == 0) {
        addr_space = "device";
      }
      goto LAB_00309a93;
    }
LAB_00309a87:
    addr_space = "device";
    goto LAB_00309a93;
  default:
    if (type->storage == StorageClassPhysicalStorageBuffer) goto switchD_0030980e_caseD_c;
  }
  addr_space = "";
  if (*(int *)&(type->super_IVariant).field_0xc == 0x15) {
    addr_space = "thread";
  }
  if (!argument) {
    addr_space = "";
  }
  if (type->pointer != false) {
    addr_space = "thread";
  }
LAB_00309a93:
  local_38 = (char **)0x3b31f2;
  if ((flags.lower & 0xa00000) == 0) {
    local_38 = (char **)0x3930a4;
  }
  join<char_const*,char_const*&>
            (__return_storage_ptr__,(spirv_cross *)&local_38,&addr_space,local_38);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	return join(flags.get(DecorationVolatile) || flags.get(DecorationCoherent) ? "volatile " : "", addr_space);
}